

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O0

int regex_init(regex_handle *re)

{
  void *pvVar1;
  regex_priv *priv;
  regex_handle *re_local;
  
  if (re->priv == (void *)0x0) {
    pvVar1 = calloc(1,8);
    if (pvVar1 == (void *)0x0) {
      return -0xc;
    }
    re->priv = pvVar1;
  }
  return 0;
}

Assistant:

int regex_init(struct regex_handle *re)
{
	struct regex_priv *priv = re->priv;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		re->priv = priv;
	}

	return 0;
}